

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall SQCompilation::SQParser::parseStringTemplate(SQParser *this)

{
  SQInteger SVar1;
  SQInteger SVar2;
  Expr **ppEVar3;
  CallExpr *this_00;
  GetFieldExpr *args_1;
  ulong uVar4;
  long lVar5;
  char local_d1;
  Expr *arg;
  SQInteger local_c8;
  SQInteger local_c0;
  SQInteger local_b8;
  SQInteger local_b0;
  sqvector<SQCompilation::Expr_*,_unsigned_int> args;
  sqvector<char,_unsigned_int> formatString;
  char buffer [64];
  
  (this->_lex)._state = LS_TEMPALTE;
  (this->_lex)._expectedToken = 0x151;
  local_b0 = (this->_lex)._tokencolumn;
  local_b8 = (this->_lex)._tokenline;
  Lex(this);
  args._alloc_ctx = this->_ctx->_vm->_sharedstate->_alloc_ctx;
  formatString._vals = (char *)0x0;
  formatString._size = 0;
  formatString._allocated = 0;
  args._vals = (Expr **)0x0;
  args._size = 0;
  args._allocated = 0;
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_c0 = (this->_lex)._tokencolumn;
  local_c8 = (this->_lex)._tokenline;
  formatString._alloc_ctx = args._alloc_ctx;
  while (lVar5 = this->_token, lVar5 != 0) {
    if (lVar5 - 0x154U < 0xfffffffffffffffd) {
      this_00 = (CallExpr *)0x0;
      reportDiagnostic(this,0x19,"STRING_LITERAL");
      goto LAB_00155c37;
    }
    appendStringData(&formatString,(this->_lex)._svalue);
    if (lVar5 == 0x153) break;
    snprintf(buffer,0x40,"%d");
    appendStringData(&formatString,buffer);
    (this->_lex)._expectedToken = -1;
    (this->_lex)._state = LS_REGULAR;
    Lex(this);
    arg = Expression(this,SQE_FUNCTION_ARG);
    sqvector<SQCompilation::Expr_*,_unsigned_int>::push_back(&args,&arg);
    if (this->_token != 0x7d) {
      reportDiagnostic(this,0x19,"}");
      this_00 = (CallExpr *)0x0;
      goto LAB_00155c37;
    }
    local_d1 = '}';
    sqvector<char,_unsigned_int>::push_back(&formatString,&local_d1);
    (this->_lex)._state = LS_TEMPALTE;
    (this->_lex)._expectedToken = 0x152;
    Lex(this);
  }
  arg = (Expr *)((ulong)arg & 0xffffffffffffff00);
  sqvector<char,_unsigned_int>::push_back(&formatString,(char *)&arg);
  this_00 = (CallExpr *)newStringLiteral(this,formatString._vals);
  SVar2 = local_b0;
  SVar1 = local_b8;
  (this_00->super_Expr).super_Node._coordinates.lineStart = (int)local_c8;
  (this_00->super_Expr).super_Node._coordinates.columnStart = (int)local_c0;
  (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
  (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
  if (args._size != 0) {
    args_1 = newNode<SQCompilation::GetFieldExpr,SQCompilation::LiteralExpr*,char_const*,bool,bool>
                       (this,(LiteralExpr *)this_00,"subst",false,true);
    (args_1->super_FieldAccessExpr).super_AccessExpr.super_Expr.super_Node._coordinates.lineStart =
         (int)SVar1;
    (args_1->super_FieldAccessExpr).super_AccessExpr.super_Expr.super_Node._coordinates.columnStart
         = (int)SVar2;
    (args_1->super_FieldAccessExpr).super_AccessExpr.super_Expr.super_Node._coordinates.lineEnd =
         (int)(this->_lex)._currentline;
    (args_1->super_FieldAccessExpr).super_AccessExpr.super_Expr.super_Node._coordinates.columnEnd =
         (int)(this->_lex)._currentcolumn;
    this_00 = newNode<SQCompilation::CallExpr,Arena*,SQCompilation::Expr*,bool>
                        (this,this->_astArena,(Expr *)args_1,false);
    ppEVar3 = args._vals;
    (this_00->super_Expr).super_Node._coordinates.lineStart = (int)SVar1;
    (this_00->super_Expr).super_Node._coordinates.columnStart = (int)SVar2;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    uVar4 = args._16_8_ & 0xffffffff;
    for (lVar5 = 0; uVar4 << 3 != lVar5; lVar5 = lVar5 + 8) {
      CallExpr::addArgument(this_00,*(Expr **)((long)ppEVar3 + lVar5));
    }
  }
  (this->_lex)._expectedToken = -1;
  (this->_lex)._state = LS_REGULAR;
  Lex(this);
LAB_00155c37:
  sqvector<SQCompilation::Expr_*,_unsigned_int>::~sqvector(&args);
  sqvector<char,_unsigned_int>::~sqvector(&formatString);
  return &this_00->super_Expr;
}

Assistant:

Expr *SQParser::parseStringTemplate() {

    // '$' TK_TEMPLATE_PREFIX? (arg TK_TEMPLATE_INFIX)* arg? TK_TEMPLATE_SUFFX

    _lex._state = LS_TEMPALTE;
    _lex._expectedToken = TK_TEMPLATE_PREFIX;

    SQInteger l = line(), c = column();

    Lex();
    int idx = 0;

    sqvector<SQChar> formatString(_ctx.allocContext());
    sqvector<Expr *> args(_ctx.allocContext());
    char buffer[64] = {0};

    SQInteger fmtL = line(), fmtC = column();
    SQInteger tok = -1;

    while ((tok = _token) != SQUIRREL_EOB) {

      if (tok != TK_TEMPLATE_PREFIX && tok != TK_TEMPLATE_INFIX && tok != TK_TEMPLATE_SUFFIX) {
          reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, _SC("STRING_LITERAL"));
          return nullptr;
      }

      appendStringData(formatString, _lex._svalue);
      if (tok != TK_TEMPLATE_SUFFIX) {
        snprintf(buffer, sizeof buffer, "%d", idx++);
        appendStringData(formatString, buffer);
        _lex._expectedToken = -1;
        _lex._state = LS_REGULAR;
        Lex();
        Expr *arg = Expression(SQE_FUNCTION_ARG);
        args.push_back(arg);

        if (_token != _SC('}')) {
            reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, _SC("}"));
            return nullptr;
        }

        formatString.push_back(_SC('}'));

        _lex._state = LS_TEMPALTE;
        _lex._expectedToken = TK_TEMPLATE_INFIX;
      }
      else {
        break;
      }
      Lex();
    }

    formatString.push_back('\0');

    Expr *result = nullptr;
    LiteralExpr *fmt = setCoordinates(newStringLiteral(&formatString[0]), fmtL, fmtC);

    if (args.empty()) {
      result = fmt;
    }
    else {
      Expr *callee = setCoordinates(newNode<GetFieldExpr>(fmt, "subst", false, /* force type method */ true), l, c);
      CallExpr *call = setCoordinates(newNode<CallExpr>(arena(), callee, false), l, c);

      for (Expr *arg : args)
        call->addArgument(arg);

      result = call;
    }

    _lex._expectedToken = -1;
    _lex._state = LS_REGULAR;
    Lex();

    return result;
}